

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

void VisitParseTreeNodes(SynBase *syntax,void *context,_func_void_void_ptr_SynBase_ptr *accept)

{
  SynTypeSimple *pSVar1;
  SynTypeArray *pSVar2;
  SynTypeReference *pSVar3;
  SynTypeFunction *pSVar4;
  SynTypeGenericInstance *pSVar5;
  SynTypeof *pSVar6;
  SynArray *pSVar7;
  SynGenerator *pSVar8;
  SynAlign *pSVar9;
  SynTypedef *pSVar10;
  SynMemberAccess *pSVar11;
  SynCallArgument *pSVar12;
  SynArrayIndex *pSVar13;
  SynFunctionCall *pSVar14;
  SynPreModify *pSVar15;
  SynPostModify *pSVar16;
  SynGetAddress *pSVar17;
  SynDereference *pSVar18;
  SynSizeof *pSVar19;
  SynNew *pSVar20;
  SynConditional *pSVar21;
  SynReturn *pSVar22;
  SynYield *pSVar23;
  SynBreak *pSVar24;
  SynContinue *pSVar25;
  SynBlock *pSVar26;
  SynIfElse *pSVar27;
  SynFor *pSVar28;
  SynForEachIterator *pSVar29;
  SynForEach *pSVar30;
  SynWhile *pSVar31;
  SynDoWhile *pSVar32;
  SynSwitchCase *pSVar33;
  SynSwitch *pSVar34;
  SynUnaryOp *pSVar35;
  SynBinaryOp *pSVar36;
  SynAssignment *pSVar37;
  SynModifyAssignment *pSVar38;
  SynVariableDefinition *pSVar39;
  SynVariableDefinitions *pSVar40;
  SynAccessor *pSVar41;
  SynFunctionArgument *pSVar42;
  SynFunctionDefinition *pSVar43;
  SynShortFunctionArgument *pSVar44;
  SynShortFunctionDefinition *pSVar45;
  SynConstant *pSVar46;
  SynConstantSet *pSVar47;
  SynClassStaticIf *pSVar48;
  SynClassElements *pSVar49;
  SynClassDefinition *pSVar50;
  SynEnumDefinition *pSVar51;
  SynNamespaceDefinition *pSVar52;
  SynModuleImport *pSVar53;
  SynModule *pSVar54;
  SynBase *local_2f0;
  SynBase *expr_1;
  SynModuleImport *import;
  SynModule *node_53;
  SynIdentifier *part_2;
  SynModuleImport *node_52;
  SynBase *arg_25;
  SynIdentifier *part_1;
  SynNamespaceDefinition *node_51;
  SynBase *arg_24;
  SynEnumDefinition *node_50;
  SynBase *arg_23;
  SynClassDefinition *node_49;
  SynBase *arg_22;
  SynBase *arg_21;
  SynBase *arg_20;
  SynBase *arg_19;
  SynBase *arg_18;
  SynBase *arg_17;
  SynClassElements *node_48;
  SynClassStaticIf *node_47;
  SynBase *arg_16;
  SynConstantSet *node_46;
  SynConstant *node_45;
  SynBase *arg_15;
  SynBase *arg_14;
  SynShortFunctionDefinition *node_44;
  SynShortFunctionArgument *node_43;
  SynBase *arg_13;
  SynBase *arg_12;
  SynBase *arg_11;
  SynFunctionDefinition *node_42;
  SynFunctionArgument *node_41;
  SynAccessor *node_40;
  SynBase *arg_10;
  SynVariableDefinitions *node_39;
  SynVariableDefinition *node_38;
  SynModifyAssignment *node_37;
  SynAssignment *node_36;
  SynBinaryOp *node_35;
  SynUnaryOp *node_34;
  SynBase *arg_9;
  SynSwitch *node_33;
  SynBase *arg_8;
  SynSwitchCase *node_32;
  SynBase *arg_7;
  SynDoWhile *node_31;
  SynWhile *node_30;
  SynBase *arg_6;
  SynForEach *node_29;
  SynForEachIterator *node_28;
  SynFor *node_27;
  SynIfElse *node_26;
  SynBase *expr;
  SynBlock *node_25;
  SynContinue *node_24;
  SynBreak *node_23;
  SynYield *node_22;
  SynReturn *node_21;
  SynConditional *node_20;
  SynBase *arg_5;
  SynBase *arg_4;
  SynNew *node_19;
  SynSizeof *node_18;
  SynDereference *node_17;
  SynGetAddress *node_16;
  SynPostModify *node_15;
  SynPreModify *node_14;
  SynBase *arg_3;
  SynBase *arg_2;
  SynFunctionCall *node_13;
  SynBase *arg_1;
  SynArrayIndex *node_12;
  SynCallArgument *node_11;
  SynMemberAccess *node_10;
  SynTypedef *node_9;
  SynAlign *node_8;
  SynBase *value_1;
  SynGenerator *node_7;
  SynBase *value;
  SynArray *node_6;
  SynTypeof *node_5;
  SynBase *type;
  SynTypeGenericInstance *node_4;
  SynBase *arg;
  SynTypeFunction *node_3;
  SynTypeReference *node_2;
  SynBase *size;
  SynTypeArray *node_1;
  SynIdentifier *part;
  SynTypeSimple *node;
  _func_void_void_ptr_SynBase_ptr *accept_local;
  void *context_local;
  SynBase *syntax_local;
  
  if (syntax != (SynBase *)0x0) {
    (*accept)(context,syntax);
    pSVar1 = getType<SynTypeSimple>(syntax);
    if (pSVar1 == (SynTypeSimple *)0x0) {
      pSVar2 = getType<SynTypeArray>(syntax);
      if (pSVar2 == (SynTypeArray *)0x0) {
        pSVar3 = getType<SynTypeReference>(syntax);
        if (pSVar3 == (SynTypeReference *)0x0) {
          pSVar4 = getType<SynTypeFunction>(syntax);
          if (pSVar4 == (SynTypeFunction *)0x0) {
            pSVar5 = getType<SynTypeGenericInstance>(syntax);
            if (pSVar5 == (SynTypeGenericInstance *)0x0) {
              pSVar6 = getType<SynTypeof>(syntax);
              if (pSVar6 == (SynTypeof *)0x0) {
                pSVar7 = getType<SynArray>(syntax);
                if (pSVar7 == (SynArray *)0x0) {
                  pSVar8 = getType<SynGenerator>(syntax);
                  if (pSVar8 == (SynGenerator *)0x0) {
                    pSVar9 = getType<SynAlign>(syntax);
                    if (pSVar9 == (SynAlign *)0x0) {
                      pSVar10 = getType<SynTypedef>(syntax);
                      if (pSVar10 == (SynTypedef *)0x0) {
                        pSVar11 = getType<SynMemberAccess>(syntax);
                        if (pSVar11 == (SynMemberAccess *)0x0) {
                          pSVar12 = getType<SynCallArgument>(syntax);
                          if (pSVar12 == (SynCallArgument *)0x0) {
                            pSVar13 = getType<SynArrayIndex>(syntax);
                            if (pSVar13 == (SynArrayIndex *)0x0) {
                              pSVar14 = getType<SynFunctionCall>(syntax);
                              if (pSVar14 == (SynFunctionCall *)0x0) {
                                pSVar15 = getType<SynPreModify>(syntax);
                                if (pSVar15 == (SynPreModify *)0x0) {
                                  pSVar16 = getType<SynPostModify>(syntax);
                                  if (pSVar16 == (SynPostModify *)0x0) {
                                    pSVar17 = getType<SynGetAddress>(syntax);
                                    if (pSVar17 == (SynGetAddress *)0x0) {
                                      pSVar18 = getType<SynDereference>(syntax);
                                      if (pSVar18 == (SynDereference *)0x0) {
                                        pSVar19 = getType<SynSizeof>(syntax);
                                        if (pSVar19 == (SynSizeof *)0x0) {
                                          pSVar20 = getType<SynNew>(syntax);
                                          if (pSVar20 == (SynNew *)0x0) {
                                            pSVar21 = getType<SynConditional>(syntax);
                                            if (pSVar21 == (SynConditional *)0x0) {
                                              pSVar22 = getType<SynReturn>(syntax);
                                              if (pSVar22 == (SynReturn *)0x0) {
                                                pSVar23 = getType<SynYield>(syntax);
                                                if (pSVar23 == (SynYield *)0x0) {
                                                  pSVar24 = getType<SynBreak>(syntax);
                                                  if (pSVar24 == (SynBreak *)0x0) {
                                                    pSVar25 = getType<SynContinue>(syntax);
                                                    if (pSVar25 == (SynContinue *)0x0) {
                                                      pSVar26 = getType<SynBlock>(syntax);
                                                      if (pSVar26 == (SynBlock *)0x0) {
                                                        pSVar27 = getType<SynIfElse>(syntax);
                                                        if (pSVar27 == (SynIfElse *)0x0) {
                                                          pSVar28 = getType<SynFor>(syntax);
                                                          if (pSVar28 == (SynFor *)0x0) {
                                                            pSVar29 = getType<SynForEachIterator>
                                                                                (syntax);
                                                            if (pSVar29 == (SynForEachIterator *)0x0
                                                               ) {
                                                              pSVar30 = getType<SynForEach>(syntax);
                                                              if (pSVar30 == (SynForEach *)0x0) {
                                                                pSVar31 = getType<SynWhile>(syntax);
                                                                if (pSVar31 == (SynWhile *)0x0) {
                                                                  pSVar32 = getType<SynDoWhile>(
                                                  syntax);
                                                  if (pSVar32 == (SynDoWhile *)0x0) {
                                                    pSVar33 = getType<SynSwitchCase>(syntax);
                                                    if (pSVar33 == (SynSwitchCase *)0x0) {
                                                      pSVar34 = getType<SynSwitch>(syntax);
                                                      if (pSVar34 == (SynSwitch *)0x0) {
                                                        pSVar35 = getType<SynUnaryOp>(syntax);
                                                        if (pSVar35 == (SynUnaryOp *)0x0) {
                                                          pSVar36 = getType<SynBinaryOp>(syntax);
                                                          if (pSVar36 == (SynBinaryOp *)0x0) {
                                                            pSVar37 = getType<SynAssignment>(syntax)
                                                            ;
                                                            if (pSVar37 == (SynAssignment *)0x0) {
                                                              pSVar38 = getType<SynModifyAssignment>
                                                                                  (syntax);
                                                              if (pSVar38 ==
                                                                  (SynModifyAssignment *)0x0) {
                                                                pSVar39 = 
                                                  getType<SynVariableDefinition>(syntax);
                                                  if (pSVar39 == (SynVariableDefinition *)0x0) {
                                                    pSVar40 = getType<SynVariableDefinitions>
                                                                        (syntax);
                                                    if (pSVar40 == (SynVariableDefinitions *)0x0) {
                                                      pSVar41 = getType<SynAccessor>(syntax);
                                                      if (pSVar41 == (SynAccessor *)0x0) {
                                                        pSVar42 = getType<SynFunctionArgument>
                                                                            (syntax);
                                                        if (pSVar42 == (SynFunctionArgument *)0x0) {
                                                          pSVar43 = getType<SynFunctionDefinition>
                                                                              (syntax);
                                                          if (pSVar43 ==
                                                              (SynFunctionDefinition *)0x0) {
                                                            pSVar44 = 
                                                  getType<SynShortFunctionArgument>(syntax);
                                                  if (pSVar44 == (SynShortFunctionArgument *)0x0) {
                                                    pSVar45 = getType<SynShortFunctionDefinition>
                                                                        (syntax);
                                                    if (pSVar45 == (SynShortFunctionDefinition *)0x0
                                                       ) {
                                                      pSVar46 = getType<SynConstant>(syntax);
                                                      if (pSVar46 == (SynConstant *)0x0) {
                                                        pSVar47 = getType<SynConstantSet>(syntax);
                                                        if (pSVar47 == (SynConstantSet *)0x0) {
                                                          pSVar48 = getType<SynClassStaticIf>
                                                                              (syntax);
                                                          if (pSVar48 == (SynClassStaticIf *)0x0) {
                                                            pSVar49 = getType<SynClassElements>
                                                                                (syntax);
                                                            if (pSVar49 == (SynClassElements *)0x0)
                                                            {
                                                              pSVar50 = getType<SynClassDefinition>
                                                                                  (syntax);
                                                              if (pSVar50 ==
                                                                  (SynClassDefinition *)0x0) {
                                                                pSVar51 = getType<SynEnumDefinition>
                                                                                    (syntax);
                                                                if (pSVar51 ==
                                                                    (SynEnumDefinition *)0x0) {
                                                                  pSVar52 = 
                                                  getType<SynNamespaceDefinition>(syntax);
                                                  if (pSVar52 == (SynNamespaceDefinition *)0x0) {
                                                    pSVar53 = getType<SynModuleImport>(syntax);
                                                    if (pSVar53 == (SynModuleImport *)0x0) {
                                                      pSVar54 = getType<SynModule>(syntax);
                                                      if (pSVar54 != (SynModule *)0x0) {
                                                        for (expr_1 = &((pSVar54->imports).head)->
                                                                       super_SynBase;
                                                            expr_1 != (SynBase *)0x0;
                                                            expr_1 = &getType<SynModuleImport>
                                                                                (expr_1->next)->
                                                                      super_SynBase) {
                                                          VisitParseTreeNodes(expr_1,context,accept)
                                                          ;
                                                        }
                                                        for (local_2f0 = (pSVar54->expressions).head
                                                            ; local_2f0 != (SynBase *)0x0;
                                                            local_2f0 = local_2f0->next) {
                                                          VisitParseTreeNodes(local_2f0,context,
                                                                              accept);
                                                        }
                                                      }
                                                    }
                                                    else {
                                                      for (node_53 = (SynModule *)
                                                                     (pSVar53->path).head;
                                                          node_53 != (SynModule *)0x0;
                                                          node_53 = (SynModule *)
                                                                    getType<SynIdentifier>
                                                                              ((node_53->
                                                                               super_SynBase).next))
                                                      {
                                                        VisitParseTreeNodes(&node_53->super_SynBase,
                                                                            context,accept);
                                                      }
                                                    }
                                                  }
                                                  else {
                                                    for (arg_25 = &((pSVar52->path).head)->
                                                                   super_SynBase;
                                                        arg_25 != (SynBase *)0x0;
                                                        arg_25 = &getType<SynIdentifier>
                                                                            (arg_25->next)->
                                                                  super_SynBase) {
                                                      VisitParseTreeNodes(arg_25,context,accept);
                                                    }
                                                    for (node_52 = (SynModuleImport *)
                                                                   (pSVar52->expressions).head;
                                                        node_52 != (SynModuleImport *)0x0;
                                                        node_52 = (SynModuleImport *)
                                                                  (node_52->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_52->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    for (node_51 = (SynNamespaceDefinition *)
                                                                   (pSVar51->values).head;
                                                        node_51 != (SynNamespaceDefinition *)0x0;
                                                        node_51 = (SynNamespaceDefinition *)
                                                                  (node_51->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_51->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(&pSVar50->align->
                                                                         super_SynBase,context,
                                                                        accept);
                                                    for (node_50 = (SynEnumDefinition *)
                                                                   (pSVar50->aliases).head;
                                                        node_50 != (SynEnumDefinition *)0x0;
                                                        node_50 = (SynEnumDefinition *)
                                                                  (node_50->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_50->super_SynBase,
                                                                          context,accept);
                                                    }
                                                    VisitParseTreeNodes(pSVar50->baseClass,context,
                                                                        accept);
                                                    VisitParseTreeNodes(&pSVar50->elements->
                                                                         super_SynBase,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    for (arg_18 = &((pSVar49->typedefs).head)->
                                                                   super_SynBase;
                                                        arg_18 != (SynBase *)0x0;
                                                        arg_18 = arg_18->next) {
                                                      VisitParseTreeNodes(arg_18,context,accept);
                                                    }
                                                    for (arg_19 = &((pSVar49->functions).head)->
                                                                   super_SynBase;
                                                        arg_19 != (SynBase *)0x0;
                                                        arg_19 = arg_19->next) {
                                                      VisitParseTreeNodes(arg_19,context,accept);
                                                    }
                                                    for (arg_20 = &((pSVar49->accessors).head)->
                                                                   super_SynBase;
                                                        arg_20 != (SynBase *)0x0;
                                                        arg_20 = arg_20->next) {
                                                      VisitParseTreeNodes(arg_20,context,accept);
                                                    }
                                                    for (arg_21 = &((pSVar49->members).head)->
                                                                   super_SynBase;
                                                        arg_21 != (SynBase *)0x0;
                                                        arg_21 = arg_21->next) {
                                                      VisitParseTreeNodes(arg_21,context,accept);
                                                    }
                                                    for (arg_22 = &((pSVar49->constantSets).head)->
                                                                   super_SynBase;
                                                        arg_22 != (SynBase *)0x0;
                                                        arg_22 = arg_22->next) {
                                                      VisitParseTreeNodes(arg_22,context,accept);
                                                    }
                                                    for (node_49 = (SynClassDefinition *)
                                                                   (pSVar49->staticIfs).head;
                                                        node_49 != (SynClassDefinition *)0x0;
                                                        node_49 = (SynClassDefinition *)
                                                                  (node_49->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_49->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar48->condition,context,
                                                                        accept);
                                                    VisitParseTreeNodes(&pSVar48->trueBlock->
                                                                         super_SynBase,context,
                                                                        accept);
                                                    VisitParseTreeNodes(&pSVar48->falseBlock->
                                                                         super_SynBase,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar47->type,context,accept
                                                                       );
                                                    for (node_47 = (SynClassStaticIf *)
                                                                   (pSVar47->constants).head;
                                                        node_47 != (SynClassStaticIf *)0x0;
                                                        node_47 = (SynClassStaticIf *)
                                                                  (node_47->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_47->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar46->value,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    for (arg_15 = &((pSVar45->arguments).head)->
                                                                   super_SynBase;
                                                        arg_15 != (SynBase *)0x0;
                                                        arg_15 = arg_15->next) {
                                                      VisitParseTreeNodes(arg_15,context,accept);
                                                    }
                                                    for (node_45 = (SynConstant *)
                                                                   (pSVar45->expressions).head;
                                                        node_45 != (SynConstant *)0x0;
                                                        node_45 = (SynConstant *)
                                                                  (node_45->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_45->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar44->type,context,accept
                                                                       );
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar43->parentType,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar43->returnType,context,
                                                                        accept);
                                                    for (arg_12 = &((pSVar43->aliases).head)->
                                                                   super_SynBase;
                                                        arg_12 != (SynBase *)0x0;
                                                        arg_12 = arg_12->next) {
                                                      VisitParseTreeNodes(arg_12,context,accept);
                                                    }
                                                    for (arg_13 = &((pSVar43->arguments).head)->
                                                                   super_SynBase;
                                                        arg_13 != (SynBase *)0x0;
                                                        arg_13 = arg_13->next) {
                                                      VisitParseTreeNodes(arg_13,context,accept);
                                                    }
                                                    for (node_43 = (SynShortFunctionArgument *)
                                                                   (pSVar43->expressions).head;
                                                        node_43 != (SynShortFunctionArgument *)0x0;
                                                        node_43 = (SynShortFunctionArgument *)
                                                                  (node_43->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_43->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar42->type,context,accept
                                                                       );
                                                    VisitParseTreeNodes(pSVar42->initializer,context
                                                                        ,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar41->getBlock,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar41->setBlock,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(&pSVar40->align->
                                                                         super_SynBase,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar40->type,context,accept
                                                                       );
                                                    for (node_40 = (SynAccessor *)
                                                                   (pSVar40->definitions).head;
                                                        node_40 != (SynAccessor *)0x0;
                                                        node_40 = (SynAccessor *)
                                                                  (node_40->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_40->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar39->initializer,context
                                                                        ,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar38->lhs,context,accept)
                                                    ;
                                                    VisitParseTreeNodes(pSVar38->rhs,context,accept)
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar37->lhs,context,accept)
                                                    ;
                                                    VisitParseTreeNodes(pSVar37->rhs,context,accept)
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar36->lhs,context,accept)
                                                    ;
                                                    VisitParseTreeNodes(pSVar36->rhs,context,accept)
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar35->value,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar34->condition,context,
                                                                        accept);
                                                    for (node_34 = (SynUnaryOp *)
                                                                   (pSVar34->cases).head;
                                                        node_34 != (SynUnaryOp *)0x0;
                                                        node_34 = (SynUnaryOp *)
                                                                  (node_34->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_34->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar33->value,context,
                                                                        accept);
                                                    for (node_33 = (SynSwitch *)
                                                                   (pSVar33->expressions).head;
                                                        node_33 != (SynSwitch *)0x0;
                                                        node_33 = (SynSwitch *)
                                                                  (node_33->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_33->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    for (node_32 = (SynSwitchCase *)
                                                                   (pSVar32->expressions).head;
                                                        node_32 != (SynSwitchCase *)0x0;
                                                        node_32 = (SynSwitchCase *)
                                                                  (node_32->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_32->super_SynBase,
                                                                          context,accept);
                                                    }
                                                    VisitParseTreeNodes(pSVar32->condition,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar31->condition,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar31->body,context,accept
                                                                       );
                                                  }
                                                  }
                                                  else {
                                                    for (node_30 = (SynWhile *)
                                                                   (pSVar30->iterators).head;
                                                        node_30 != (SynWhile *)0x0;
                                                        node_30 = (SynWhile *)
                                                                  (node_30->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_30->super_SynBase,
                                                                          context,accept);
                                                    }
                                                    VisitParseTreeNodes(pSVar30->body,context,accept
                                                                       );
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar29->type,context,accept
                                                                       );
                                                    VisitParseTreeNodes(pSVar29->value,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar28->initializer,context
                                                                        ,accept);
                                                    VisitParseTreeNodes(pSVar28->condition,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar28->increment,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar28->body,context,accept
                                                                       );
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(pSVar27->condition,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar27->trueBlock,context,
                                                                        accept);
                                                    VisitParseTreeNodes(pSVar27->falseBlock,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    for (node_26 = (SynIfElse *)
                                                                   (pSVar26->expressions).head;
                                                        node_26 != (SynIfElse *)0x0;
                                                        node_26 = (SynIfElse *)
                                                                  (node_26->super_SynBase).next) {
                                                      VisitParseTreeNodes(&node_26->super_SynBase,
                                                                          context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(&pSVar25->number->
                                                                         super_SynBase,context,
                                                                        accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitParseTreeNodes(&pSVar24->number->
                                                                         super_SynBase,context,
                                                                        accept);
                                                  }
                                                }
                                                else {
                                                  VisitParseTreeNodes(pSVar23->value,context,accept)
                                                  ;
                                                }
                                              }
                                              else {
                                                VisitParseTreeNodes(pSVar22->value,context,accept);
                                              }
                                            }
                                            else {
                                              VisitParseTreeNodes(pSVar21->condition,context,accept)
                                              ;
                                              VisitParseTreeNodes(pSVar21->trueBlock,context,accept)
                                              ;
                                              VisitParseTreeNodes(pSVar21->falseBlock,context,accept
                                                                 );
                                            }
                                          }
                                          else {
                                            VisitParseTreeNodes(pSVar20->type,context,accept);
                                            for (arg_5 = &((pSVar20->arguments).head)->super_SynBase
                                                ; arg_5 != (SynBase *)0x0; arg_5 = arg_5->next) {
                                              VisitParseTreeNodes(arg_5,context,accept);
                                            }
                                            VisitParseTreeNodes(pSVar20->count,context,accept);
                                            for (node_20 = (SynConditional *)
                                                           (pSVar20->constructor).head;
                                                node_20 != (SynConditional *)0x0;
                                                node_20 = (SynConditional *)
                                                          (node_20->super_SynBase).next) {
                                              VisitParseTreeNodes(&node_20->super_SynBase,context,
                                                                  accept);
                                            }
                                          }
                                        }
                                        else {
                                          VisitParseTreeNodes(pSVar19->value,context,accept);
                                        }
                                      }
                                      else {
                                        VisitParseTreeNodes(pSVar18->value,context,accept);
                                      }
                                    }
                                    else {
                                      VisitParseTreeNodes(pSVar17->value,context,accept);
                                    }
                                  }
                                  else {
                                    VisitParseTreeNodes(pSVar16->value,context,accept);
                                  }
                                }
                                else {
                                  VisitParseTreeNodes(pSVar15->value,context,accept);
                                }
                              }
                              else {
                                VisitParseTreeNodes(pSVar14->value,context,accept);
                                for (arg_3 = (pSVar14->aliases).head; arg_3 != (SynBase *)0x0;
                                    arg_3 = arg_3->next) {
                                  VisitParseTreeNodes(arg_3,context,accept);
                                }
                                for (node_14 = (SynPreModify *)(pSVar14->arguments).head;
                                    node_14 != (SynPreModify *)0x0;
                                    node_14 = (SynPreModify *)(node_14->super_SynBase).next) {
                                  VisitParseTreeNodes(&node_14->super_SynBase,context,accept);
                                }
                              }
                            }
                            else {
                              VisitParseTreeNodes(pSVar13->value,context,accept);
                              for (node_13 = (SynFunctionCall *)(pSVar13->arguments).head;
                                  node_13 != (SynFunctionCall *)0x0;
                                  node_13 = (SynFunctionCall *)(node_13->super_SynBase).next) {
                                VisitParseTreeNodes(&node_13->super_SynBase,context,accept);
                              }
                            }
                          }
                          else {
                            VisitParseTreeNodes(pSVar12->value,context,accept);
                          }
                        }
                        else {
                          VisitParseTreeNodes(pSVar11->value,context,accept);
                        }
                      }
                      else {
                        VisitParseTreeNodes(pSVar10->type,context,accept);
                      }
                    }
                    else {
                      VisitParseTreeNodes(pSVar9->value,context,accept);
                    }
                  }
                  else {
                    for (node_8 = (SynAlign *)(pSVar8->expressions).head; node_8 != (SynAlign *)0x0;
                        node_8 = (SynAlign *)(node_8->super_SynBase).next) {
                      VisitParseTreeNodes(&node_8->super_SynBase,context,accept);
                    }
                  }
                }
                else {
                  for (node_7 = (SynGenerator *)(pSVar7->values).head; node_7 != (SynGenerator *)0x0
                      ; node_7 = (SynGenerator *)(node_7->super_SynBase).next) {
                    VisitParseTreeNodes(&node_7->super_SynBase,context,accept);
                  }
                }
              }
              else {
                VisitParseTreeNodes(pSVar6->value,context,accept);
              }
            }
            else {
              VisitParseTreeNodes(pSVar5->baseType,context,accept);
              for (node_5 = (SynTypeof *)(pSVar5->types).head; node_5 != (SynTypeof *)0x0;
                  node_5 = (SynTypeof *)(node_5->super_SynBase).next) {
                VisitParseTreeNodes(&node_5->super_SynBase,context,accept);
              }
            }
          }
          else {
            VisitParseTreeNodes(pSVar4->returnType,context,accept);
            for (node_4 = (SynTypeGenericInstance *)(pSVar4->arguments).head;
                node_4 != (SynTypeGenericInstance *)0x0;
                node_4 = (SynTypeGenericInstance *)(node_4->super_SynBase).next) {
              VisitParseTreeNodes(&node_4->super_SynBase,context,accept);
            }
          }
        }
        else {
          VisitParseTreeNodes(pSVar3->type,context,accept);
        }
      }
      else {
        VisitParseTreeNodes(pSVar2->type,context,accept);
        for (node_2 = (SynTypeReference *)(pSVar2->sizes).head; node_2 != (SynTypeReference *)0x0;
            node_2 = (SynTypeReference *)(node_2->super_SynBase).next) {
          VisitParseTreeNodes(&node_2->super_SynBase,context,accept);
        }
      }
    }
    else {
      for (node_1 = (SynTypeArray *)(pSVar1->path).head; node_1 != (SynTypeArray *)0x0;
          node_1 = (SynTypeArray *)getType<SynIdentifier>((node_1->super_SynBase).next)) {
        VisitParseTreeNodes(&node_1->super_SynBase,context,accept);
      }
    }
  }
  return;
}

Assistant:

void VisitParseTreeNodes(SynBase *syntax, void *context, void(*accept)(void *context, SynBase *child))
{
	if(!syntax)
		return;

	accept(context, syntax);

	if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			VisitParseTreeNodes(part, context, accept);
	}
	else if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *size = node->sizes.head; size; size = size->next)
			VisitParseTreeNodes(size, context, accept);
	}
	else if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
	}
	else if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		VisitParseTreeNodes(node->returnType, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		VisitParseTreeNodes(node->baseType, context, accept);

		for(SynBase *type = node->types.head; type; type = type->next)
			VisitParseTreeNodes(type, context, accept);
	}
	else if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynArray *node = getType<SynArray>(syntax))
	{
		for(SynBase *value = node->values.head; value; value = value->next)
			VisitParseTreeNodes(value, context, accept);
	}
	else if(SynGenerator *node = getType<SynGenerator>(syntax))
	{
		for(SynBase *value = node->expressions.head; value; value = value->next)
			VisitParseTreeNodes(value, context, accept);
	}
	else if(SynAlign *node = getType<SynAlign>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
	}
	else if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynCallArgument *node = getType<SynCallArgument>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynFunctionCall *node = getType<SynFunctionCall>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynPreModify *node = getType<SynPreModify>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynPostModify *node = getType<SynPostModify>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynGetAddress *node = getType<SynGetAddress>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynDereference *node = getType<SynDereference>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynSizeof *node = getType<SynSizeof>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynNew *node = getType<SynNew>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->count, context, accept);

		for(SynBase *arg = node->constructor.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynConditional *node = getType<SynConditional>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->trueBlock, context, accept);
		VisitParseTreeNodes(node->falseBlock, context, accept);
	}
	else if(SynReturn *node = getType<SynReturn>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynYield *node = getType<SynYield>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynBreak *node = getType<SynBreak>(syntax))
	{
		VisitParseTreeNodes(node->number, context, accept);
	}
	else if(SynContinue *node = getType<SynContinue>(syntax))
	{
		VisitParseTreeNodes(node->number, context, accept);
	}
	else if(SynBlock *node = getType<SynBlock>(syntax))
	{
		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitParseTreeNodes(expr, context, accept);
	}
	else if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->trueBlock, context, accept);
		VisitParseTreeNodes(node->falseBlock, context, accept);
	}
	else if(SynFor *node = getType<SynFor>(syntax))
	{
		VisitParseTreeNodes(node->initializer, context, accept);
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->increment, context, accept);
		VisitParseTreeNodes(node->body, context, accept);
	}
	else if(SynForEachIterator *node = getType<SynForEachIterator>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynForEach *node = getType<SynForEach>(syntax))
	{
		for(SynBase *arg = node->iterators.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->body, context, accept);
	}
	else if(SynWhile *node = getType<SynWhile>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->body, context, accept);
	}
	else if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->condition, context, accept);
	}
	else if(SynSwitchCase *node = getType<SynSwitchCase>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);

		for(SynBase *arg = node->cases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynUnaryOp *node = getType<SynUnaryOp>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynBinaryOp *node = getType<SynBinaryOp>(syntax))
	{
		VisitParseTreeNodes(node->lhs, context, accept);
		VisitParseTreeNodes(node->rhs, context, accept);
	}
	else if(SynAssignment *node = getType<SynAssignment>(syntax))
	{
		VisitParseTreeNodes(node->lhs, context, accept);
		VisitParseTreeNodes(node->rhs, context, accept);
	}
	else if(SynModifyAssignment *node = getType<SynModifyAssignment>(syntax))
	{
		VisitParseTreeNodes(node->lhs, context, accept);
		VisitParseTreeNodes(node->rhs, context, accept);
	}
	else if(SynVariableDefinition *node = getType<SynVariableDefinition>(syntax))
	{
		VisitParseTreeNodes(node->initializer, context, accept);
	}
	else if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		VisitParseTreeNodes(node->align, context, accept);
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *arg = node->definitions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynAccessor *node = getType<SynAccessor>(syntax))
	{
		VisitParseTreeNodes(node->getBlock, context, accept);
		VisitParseTreeNodes(node->setBlock, context, accept);
	}
	else if(SynFunctionArgument *node = getType<SynFunctionArgument>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
		VisitParseTreeNodes(node->initializer, context, accept);
	}
	else if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		VisitParseTreeNodes(node->parentType, context, accept);
		VisitParseTreeNodes(node->returnType, context, accept);

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynShortFunctionArgument *node = getType<SynShortFunctionArgument>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
	}
	else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(syntax))
	{
		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynConstant *node = getType<SynConstant>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynConstantSet *node = getType<SynConstantSet>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *arg = node->constants.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynClassStaticIf *node = getType<SynClassStaticIf>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->trueBlock, context, accept);
		VisitParseTreeNodes(node->falseBlock, context, accept);
	}
	else if(SynClassElements *node = getType<SynClassElements>(syntax))
	{
		for(SynBase *arg = node->typedefs.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->functions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->accessors.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->members.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->constantSets.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->staticIfs.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		VisitParseTreeNodes(node->align, context, accept);

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->baseClass, context, accept);
		VisitParseTreeNodes(node->elements, context, accept);
	}
	else if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		for(SynBase *arg = node->values.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			VisitParseTreeNodes(part, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynModuleImport *node = getType<SynModuleImport>(syntax))
	{
		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			VisitParseTreeNodes(part, context, accept);
	}
	else if(SynModule *node = getType<SynModule>(syntax))
	{
		for(SynModuleImport *import = node->imports.head; import; import = getType<SynModuleImport>(import->next))
			VisitParseTreeNodes(import, context, accept);

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitParseTreeNodes(expr, context, accept);
	}
}